

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

jpeg_scan_info * fill_scans(jpeg_scan_info *scanptr,int ncomps,int Ss,int Se,int Ah,int Al)

{
  int ci;
  int Al_local;
  int Ah_local;
  int Se_local;
  int Ss_local;
  int ncomps_local;
  jpeg_scan_info *scanptr_local;
  
  scanptr_local = scanptr;
  for (ci = 0; ci < ncomps; ci = ci + 1) {
    scanptr_local->comps_in_scan = 1;
    scanptr_local->component_index[0] = ci;
    scanptr_local->Ss = Ss;
    scanptr_local->Se = Se;
    scanptr_local->Ah = Ah;
    scanptr_local->Al = Al;
    scanptr_local = scanptr_local + 1;
  }
  return scanptr_local;
}

Assistant:

LOCAL(jpeg_scan_info *)
fill_scans (jpeg_scan_info * scanptr, int ncomps,
	    int Ss, int Se, int Ah, int Al)
/* Support routine: generate one scan for each component */
{
  int ci;

  for (ci = 0; ci < ncomps; ci++) {
    scanptr->comps_in_scan = 1;
    scanptr->component_index[0] = ci;
    scanptr->Ss = Ss;
    scanptr->Se = Se;
    scanptr->Ah = Ah;
    scanptr->Al = Al;
    scanptr++;
  }
  return scanptr;
}